

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O3

void ncnn::copy_make_border
               (Mat *src,Mat *dst,int top,int bottom,int left,int right,int type,float v,Option *opt
               )

{
  int *piVar1;
  void *__ptr;
  long *plVar2;
  Layer *pLVar3;
  long lVar4;
  ParamDict pd;
  ParamDict local_930;
  
  pLVar3 = create_layer(0x2b);
  ParamDict::ParamDict(&local_930);
  ParamDict::set(&local_930,0,top);
  ParamDict::set(&local_930,1,bottom);
  ParamDict::set(&local_930,2,left);
  ParamDict::set(&local_930,3,right);
  ParamDict::set(&local_930,4,type);
  ParamDict::set(&local_930,5,v);
  (*pLVar3->_vptr_Layer[2])(pLVar3,&local_930);
  (*pLVar3->_vptr_Layer[7])(pLVar3,src,dst,opt);
  (*pLVar3->_vptr_Layer[1])(pLVar3);
  lVar4 = 0x8c0;
  do {
    piVar1 = *(int **)((long)&local_930.params[0].v.data + lVar4);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        __ptr = *(void **)((long)&local_930.params[0].type + lVar4);
        plVar2 = *(long **)((long)&local_930.params[0].v.elempack + lVar4);
        if (plVar2 == (long *)0x0) {
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
        }
        else {
          (**(code **)(*plVar2 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&local_930.params[0].v.data + lVar4 + 4) = 0;
    *(undefined8 *)((long)&local_930.params[0].v.refcount + lVar4 + 4) = 0;
    *(undefined8 *)((long)&local_930.params[0].type + lVar4) = 0;
    *(undefined8 *)((long)&local_930.params[0].v.data + lVar4) = 0;
    *(undefined8 *)((long)&local_930.params[0].v.allocator + lVar4) = 0;
    *(undefined8 *)((long)&local_930.params[0].v.dims + lVar4) = 0;
    *(undefined8 *)((long)&local_930.params[0].v.h + lVar4) = 0;
    lVar4 = lVar4 + -0x48;
  } while (lVar4 != -0x40);
  return;
}

Assistant:

void copy_make_border(const Mat& src, Mat& dst, int top, int bottom, int left, int right, int type, float v, const Option& opt)
{
    ncnn::Layer* padding = ncnn::create_layer(ncnn::LayerType::Padding);

    ncnn::ParamDict pd;
    pd.set(0, top);
    pd.set(1, bottom);
    pd.set(2, left);
    pd.set(3, right);
    pd.set(4, type);
    pd.set(5, v);

    padding->load_param(pd);

    padding->forward(src, dst, opt);

    delete padding;
}